

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_FieldNumberConflict_Test::
~ValidationErrorTest_FieldNumberConflict_Test(ValidationErrorTest_FieldNumberConflict_Test *this)

{
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_01884b50;
  DescriptorPool::~DescriptorPool(&(this->super_ValidationErrorTest).pool_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x88);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, FieldNumberConflict) {
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
        }
      )pb",
      "foo.proto: Foo.bar: NUMBER: Field number 1 has already been used in "
      "\"Foo\" by field \"foo\". Next available field number is 2.\n");

  // Now we add other fields, extension ranges, reserved fields, etc.
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field { name: "baz" number: 2 label: LABEL_OPTIONAL type: TYPE_INT32 }
          extension_range { start: 3 end: 6 }
          field { name: "bak" number: 6 label: LABEL_OPTIONAL type: TYPE_INT32 }
          extension_range { start: 7 end: 10 }
          field { name: "bm" number: 10 label: LABEL_OPTIONAL type: TYPE_INT32 }
          reserved_range { start: 11 end: 20 }
          field { name: "bt" number: 20 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field { name: "br" number: 22 label: LABEL_OPTIONAL type: TYPE_INT32 }
        }
      )pb",
      "foo.proto: Foo.bar: NUMBER: Field number 1 has already been used in "
      "\"Foo\" by field \"foo\". Next available field number is 21.\n");

  // Now there are no available numbers.
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          field { name: "bar" number: 1 label: LABEL_OPTIONAL type: TYPE_INT32 }
          reserved_range { start: 2 end: 536870913 }
        }
      )pb",
      "foo.proto: Foo.bar: NUMBER: Field number 1 has already been used in "
      "\"Foo\" by field \"foo\". There are no available field numbers.\n");

  // Overflow check. Exhaust the whole range, and make the field number INT_MAX.
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 2147483647 type: TYPE_INT32 }
          field { name: "bar" number: 2147483647 type: TYPE_INT32 }
          reserved_range { start: 1 end: 2147483647 }
        }
      )pb",
      HasSubstr("There are no available field numbers."));
  // Overflow check. Exhaust the whole range, and make ranges INT_MAX, INT_MIN.
  // The input is invalid, so we only care that it doesn't trigger a sanitizer
  // failure.
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 type: TYPE_INT32 }
          field { name: "bar" number: 1 type: TYPE_INT32 }
          extension_range { start: 2 end: 2147483647 }
          extension_range { start: 2 end: -2147483648 }
        }
      )pb",
      HasSubstr("field number"));
  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        message_type {
          name: "Foo"
          field { name: "foo" number: 1 type: TYPE_INT32 }
          field { name: "bar" number: 1 type: TYPE_INT32 }
          reserved_range { start: 2 end: 2147483647 }
          reserved_range { start: 2 end: -2147483648 }
        }
      )pb",
      HasSubstr("field number"));
}